

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512(uint16_t *data,uint32_t len,uint32_t *flags)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  int i_4;
  int j_1;
  uint32_t *v;
  int i_3;
  int j;
  int i_2;
  __m512i d_15;
  __m512i a_15;
  __m512i d_14;
  __m512i a_14;
  __m512i d_13;
  __m512i a_13;
  __m512i d_12;
  __m512i a_12;
  __m512i d_11;
  __m512i a_11;
  __m512i d_10;
  __m512i a_10;
  __m512i d_9;
  __m512i a_9;
  __m512i d_8;
  __m512i a_8;
  __m512i d_7;
  __m512i a_7;
  __m512i d_6;
  __m512i a_6;
  __m512i d_5;
  __m512i a_5;
  __m512i d_4;
  __m512i a_4;
  __m512i d_3;
  __m512i a_3;
  __m512i d_2;
  __m512i a_2;
  __m512i d_1;
  __m512i a_1;
  __m512i d;
  __m512i a;
  int i_1;
  uint32_t n_cycles;
  __m512i *data_vectors;
  uint32_t out_counters [16];
  int i;
  __m512i one_mask;
  __m512i counters [16];
  __m512i masks [16];
  int local_4360;
  int local_435c;
  int local_434c;
  int local_4348;
  uint local_4344;
  uint local_3b20;
  int local_3b10 [19];
  uint local_3ac4;
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  long local_3258;
  uint local_324c;
  long local_3248;
  undefined1 local_3240 [64];
  undefined4 local_31c4;
  undefined1 local_31c0 [64];
  undefined4 local_3144;
  undefined1 local_10c0 [64];
  ushort local_1046;
  
  local_3144 = 1;
  auVar1 = vpbroadcastd_avx512f(ZEXT416(1));
  local_31c0 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(local_31c0);
  local_3ac0 = vmovdqa64_avx512f(auVar1);
  for (local_3ac4 = 0; (int)local_3ac4 < 0x10; local_3ac4 = local_3ac4 + 1) {
    local_1046 = (ushort)(1 << (local_3ac4 & 0x1f));
    auVar1 = vpbroadcastw_avx512bw(ZEXT216(local_1046));
    local_10c0 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(local_10c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    *(undefined1 (*) [64])(local_3680 + (long)(int)local_3ac4 * 0x40) = auVar1;
    local_31c4 = 0;
    auVar1 = vpbroadcastd_avx512f(ZEXT416(0));
    local_3240 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(local_3240);
    auVar1 = vmovdqa64_avx512f(auVar1);
    *(undefined1 (*) [64])(local_3a80 + (long)(int)local_3ac4 * 0x40) = auVar1;
  }
  local_3258 = in_RDX;
  local_324c = in_ESI;
  local_3248 = in_RDI;
  memset(local_3b10,0,0x40);
  for (local_3b20 = 0; local_3b20 < local_324c >> 5; local_3b20 = local_3b20 + 1) {
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3680);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x10));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3a80);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3a80 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3640);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(1));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x11));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3a40);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3a40 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3600);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(2));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x12));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3a00);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3a00 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_35c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(3));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x13));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_39c0);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_39c0 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3580);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(4));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x14));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3980);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3980 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3540);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(5));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x15));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3940);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3940 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3500);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(6));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x16));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3900);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3900 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_34c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(7));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x17));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_38c0);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_38c0 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3480);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(8));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x18));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3880);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3880 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3440);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(9));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x19));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3840);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3840 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3400);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(10));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1a));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3800);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3800 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_33c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0xb));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1b));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_37c0);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_37c0 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3380);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0xc));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1c));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3780);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3780 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3340);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0xd));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1d));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3740);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3740 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_3300);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0xe));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1e));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_3700);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_3700 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3248 + (long)(int)local_3b20 * 0x40));
    auVar2 = vmovdqa64_avx512f(local_32c0);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpandd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar2 = vpsrld_avx512f(auVar2,ZEXT416(0xf));
    auVar3 = vmovdqa64_avx512f(local_3ac0);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar2 = vpandd_avx512f(auVar2,auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar3 = vpsrld_avx512f(auVar1,ZEXT416(0x1f));
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(local_36c0);
    auVar3 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar2);
    auVar2 = vmovdqa64_avx512f(auVar3);
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar2 = vmovdqa64_avx512f(auVar2);
    auVar1 = vpaddd_avx512f(auVar1,auVar2);
    local_36c0 = vmovdqa64_avx512f(auVar1);
  }
  for (local_4344 = (local_324c >> 5) << 5; local_4344 < local_324c; local_4344 = local_4344 + 1) {
    for (local_4348 = 0; local_4348 < 0x10; local_4348 = local_4348 + 1) {
      local_3b10[local_4348] =
           ((int)((uint)*(ushort *)(local_3248 + (long)(int)local_4344 * 2) &
                 1 << ((byte)local_4348 & 0x1f)) >> ((byte)local_4348 & 0x1f)) +
           local_3b10[local_4348];
    }
  }
  for (local_434c = 0; local_434c < 0x10; local_434c = local_434c + 1) {
    for (local_435c = 0; local_435c < 0x10; local_435c = local_435c + 1) {
      local_3b10[local_434c] =
           *(int *)(local_3a80 + (long)local_435c * 4 + (long)local_434c * 0x40) +
           local_3b10[local_434c];
    }
  }
  for (local_4360 = 0; local_4360 < 0x10; local_4360 = local_4360 + 1) {
    *(int *)(local_3258 + (long)local_4360 * 4) = local_3b10[local_4360];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    __m512i counters[16];
    const __m512i one_mask = _mm512_set1_epi32(1);
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm512_set1_epi16(1 << i);
        counters[i] = _mm512_set1_epi32(0);
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) {                                            \
    __m512i a   = _mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]); \
    __m512i d   = _mm512_add_epi32(_mm512_and_epi32(_mm512_srli_epi32(a, pos), one_mask), _mm512_srli_epi32(a, pos+16)); \
    counters[pos] = _mm512_add_epi32(counters[pos], d);          \
}
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

#undef BLOCK
#undef UPDATE

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) {
        uint32_t* v = (uint32_t*)(&counters[i]);
        for (int j = 0; j < 16; ++j)
            out_counters[i] += v[j];
    }
 
    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}